

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_diff.c
# Opt level: O1

int byte_diff(char *s,uint n,char *t)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  if (n == 0) {
    return 0;
  }
  lVar2 = 0;
  do {
    if (s[lVar2] != t[lVar2]) {
      pbVar3 = (byte *)(t + lVar2);
      pbVar4 = (byte *)(s + lVar2);
LAB_00106071:
      return (uint)*pbVar4 - (uint)*pbVar3;
    }
    iVar1 = (int)lVar2;
    if (n - 1 == iVar1) {
      return 0;
    }
    if (s[lVar2 + 1] != t[lVar2 + 1]) {
      pbVar3 = (byte *)(t + lVar2 + 1);
      pbVar4 = (byte *)(s + lVar2 + 1);
      goto LAB_00106071;
    }
    if (n - 2 == iVar1) {
      return 0;
    }
    if (s[lVar2 + 2] != t[lVar2 + 2]) {
      pbVar3 = (byte *)(t + lVar2 + 2);
      pbVar4 = (byte *)(s + lVar2 + 2);
      goto LAB_00106071;
    }
    if (n - 3 == iVar1) {
      return 0;
    }
    if (s[lVar2 + 3] != t[lVar2 + 3]) {
      pbVar3 = (byte *)(t + lVar2 + 3);
      pbVar4 = (byte *)(s + lVar2 + 3);
      goto LAB_00106071;
    }
    lVar2 = lVar2 + 4;
    if (n == (uint)lVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

int byte_diff(s,n,t)
register char *s;
register unsigned int n;
register char *t;
{
  for (;;) {
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
    if (!n) return 0; if (*s != *t) break; ++s; ++t; --n;
  }
  return ((int)(unsigned int)(unsigned char) *s)
       - ((int)(unsigned int)(unsigned char) *t);
}